

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherical_micro_batcher.hpp
# Opt level: O0

value_type * __thiscall
IntegratorXX::
SphericalMicroBatcher<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
::const_iterator::operator*(value_type *__return_storage_ptr__,const_iterator *this)

{
  type *__args;
  __tuple_element_t<1UL,_tuple<array<double,_3UL>,_array<double,_3UL>_>_> *__args_1;
  __normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  in_RCX;
  allocator<double> local_121;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_120;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_118;
  vector<double,_std::allocator<double>_> local_110;
  allocator<std::array<double,_3UL>_> local_e1;
  __normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  local_e0;
  __normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  local_d8;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> local_d0;
  __tuple_element_t<1UL,_tuple<array<double,_3UL>,_array<double,_3UL>_>_> *local_b8;
  type *box_up;
  type *box_lo;
  detail *local_a0;
  tuple<std::array<double,_3UL>,_std::array<double,_3UL>_> local_98;
  __tuple_element_t<4UL,_tuple<unsigned_long,___normal_iterator<const_array<double,_3UL>_*,_vector<array<double,_3UL>,_allocator<array<double,_3UL>_>_>_>,___normal_iterator<const_array<double,_3UL>_*,_vector<array<double,_3UL>,_allocator<array<double,_3UL>_>_>_>,___normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,___normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>_>_>
  *local_68;
  type *we;
  type *wb;
  type *pe;
  type *pb;
  type *npts;
  const_iterator *local_18;
  const_iterator *this_local;
  
  local_18 = this;
  this_local = (const_iterator *)__return_storage_ptr__;
  range((tuple<unsigned_long,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
         *)&npts,this);
  pb = (type *)std::
               get<0ul,unsigned_long,__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                         ((tuple<unsigned_long,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                           *)&npts);
  pe = std::
       get<1ul,unsigned_long,__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                 ((tuple<unsigned_long,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                   *)&npts);
  wb = (type *)std::
               get<2ul,unsigned_long,__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                         ((tuple<unsigned_long,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                           *)&npts);
  we = std::
       get<3ul,unsigned_long,__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                 ((tuple<unsigned_long,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                   *)&npts);
  local_68 = std::
             get<4ul,unsigned_long,__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                       ((tuple<unsigned_long,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                         *)&npts);
  local_a0 = (detail *)pe->_M_current;
  box_lo = (type *)wb->_M_current;
  detail::
  get_box_bounds_points<__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>>
            (&local_98,local_a0,
             (__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
              )box_lo,in_RCX);
  box_up = std::get<0ul,std::array<double,3ul>,std::array<double,3ul>>(&local_98);
  __args_1 = std::get<1ul,std::array<double,3ul>,std::array<double,3ul>>(&local_98);
  __args = box_up;
  local_d8._M_current = pe->_M_current;
  local_e0._M_current = (array<double,_3UL> *)wb->_M_current;
  local_b8 = __args_1;
  std::allocator<std::array<double,_3UL>_>::allocator(&local_e1);
  std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>::
  vector<__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,void>
            ((vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>> *)&local_d0,
             local_d8,local_e0,&local_e1);
  local_118._M_current = we->_M_current;
  local_120._M_current = local_68->_M_current;
  std::allocator<double>::allocator(&local_121);
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&local_110,local_118,local_120,&local_121);
  std::
  make_tuple<std::array<double,3ul>&,std::array<double,3ul>&,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
            (__return_storage_ptr__,__args,__args_1,&local_d0,&local_110);
  std::vector<double,_std::allocator<double>_>::~vector(&local_110);
  std::allocator<double>::~allocator(&local_121);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
            (&local_d0);
  std::allocator<std::array<double,_3UL>_>::~allocator(&local_e1);
  return __return_storage_ptr__;
}

Assistant:

value_type operator*() {

      auto [npts,pb,pe,wb,we] = range();
      auto [box_lo, box_up]   = detail::get_box_bounds_points(pb, pe);

      return std::make_tuple(
        box_lo,
        box_up,
        std::vector<point_type>( pb, pe ),
        std::vector<weight_type>( wb, we )
      );

    }